

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O1

int convert85(uchar *bytes4,uchar *chars5)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  
  if ((((*bytes4 == 0) && (bytes4[1] == '\0')) && (bytes4[2] == '\0')) && (bytes4[3] == '\0')) {
    *chars5 = 'z';
    return 1;
  }
  uVar3 = (uint)bytes4[3] | (uint)bytes4[2] << 8 | (uint)bytes4[1] << 0x10 | (uint)*bytes4 << 0x18;
  lVar4 = (ulong)uVar3 * 0xa48e60bf;
  *chars5 = (byte)((ulong)lVar4 >> 0x39) + 0x21;
  uVar3 = uVar3 + (uint)((ulong)lVar4 >> 0x39) * -0x31c84b1;
  uVar1 = (uint)((ulong)uVar3 * 0x1b51a31 >> 0x20);
  chars5[1] = (char)(uVar1 >> 0xc) + '!';
  uVar3 = uVar3 + (uVar1 >> 0xc) * -0x95eed;
  uVar1 = (uint)((ulong)uVar3 * 0x122437 >> 0x20);
  chars5[2] = (char)(uVar1 >> 1) + '!';
  uVar3 = uVar3 + (uVar1 >> 1) * -0x1c39;
  cVar2 = (char)((ulong)uVar3 * 0x3030304 >> 0x20);
  chars5[3] = cVar2 + '!';
  chars5[4] = (char)uVar3 + cVar2 * -0x55 + '!';
  return 5;
}

Assistant:

static int convert85(const uchar *bytes4, uchar *chars5)
{
  if (bytes4[0] == 0 && bytes4[1] == 0 && bytes4[2] == 0 && bytes4[3] == 0) {
    chars5[0] = 'z';
    return 1;
  }
  unsigned val = bytes4[0]*(256*256*256) + bytes4[1]*(256*256) + bytes4[2]*256 + bytes4[3];
  chars5[0] = val / 52200625 + 33; // 52200625 = 85 to the 4th
  val = val % 52200625;
  chars5[1] = val / 614125 + 33;   // 614125 = 85 cube
  val = val % 614125;
  chars5[2] = val / 7225 + 33;     // 7225 = 85 squared
  val = val % 7225;
  chars5[3] = val / 85 + 33;
  chars5[4] = val % 85 + 33;
  return 5;
}